

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

Lhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::pop(SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
      *this)

{
  long *in_RSI;
  Node *in_RDI;
  uint i;
  uint h;
  Node *node;
  Lhs *val;
  SelectedSummand *s;
  uint h_00;
  Node *node_00;
  SelectedSummand local_58;
  undefined1 local_21;
  uint local_20;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(*in_RSI + 0x30);
  local_1c = 1;
  while ((local_1c < *(uint *)(in_RSI + 1) &&
         (*(long *)(*in_RSI + 0x30 + (ulong)local_1c * 8) == local_18))) {
    local_1c = local_1c + 1;
  }
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    *(undefined8 *)(*in_RSI + 0x30 + (ulong)local_20 * 8) =
         *(undefined8 *)(local_18 + 0x30 + (ulong)local_20 * 8);
  }
  local_21 = 0;
  s = &local_58;
  node_00 = in_RDI;
  Kernel::SelectedSummand::SelectedSummand((SelectedSummand *)in_RDI,s);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&node_00->value,s);
  h_00 = (uint)((ulong)s >> 0x20);
  Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3e3d16);
  deallocate(node_00,h_00);
  return &in_RDI->value;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }